

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

ByteData * __thiscall cfd::core::Pubkey::GetData(ByteData *__return_storage_ptr__,Pubkey *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  Pubkey *local_18;
  Pubkey *this_local;
  
  local_18 = this;
  this_local = (Pubkey *)__return_storage_ptr__;
  ByteData::GetBytes(&local_30,&this->data_);
  ByteData::ByteData(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData Pubkey::GetData() const { return data_.GetBytes(); }